

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::handlePackOffset
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *location,
          TString *component)

{
  size_type __n;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_50;
  
  __n = location->_M_string_length;
  if ((__n == 0) || (pcVar4 = (location->_M_dataplus)._M_p, *pcVar4 != 'c')) {
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar4 = "expected \'c\'";
LAB_0041c1d3:
    (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar4,"packoffset","",UNRECOVERED_JUMPTABLE);
    return;
  }
  if (__n == 1) {
    return;
  }
  if (9 < (int)pcVar4[1] - 0x30U) {
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar4 = "expected number after \'c\'";
    goto LAB_0041c1d3;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::substr
            (&local_50,location,1,__n);
  iVar2 = atoi(local_50._M_dataplus._M_p);
  qualifier->layoutOffset = iVar2 * 0x10;
  if (component == (TString *)0x0) {
    return;
  }
  switch(*(component->_M_dataplus)._M_p) {
  case 'w':
    iVar3 = 0xc;
    break;
  case 'x':
    bVar1 = false;
    iVar3 = 0;
    goto LAB_0041c293;
  case 'y':
    iVar3 = 4;
    break;
  case 'z':
    iVar3 = 8;
    break;
  default:
    iVar3 = -1;
    bVar1 = true;
    goto LAB_0041c293;
  }
  bVar1 = false;
LAB_0041c293:
  if ((bVar1) || (1 < component->_M_string_length)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"expected {x, y, z, w} for component","packoffset","");
  }
  else {
    qualifier->layoutOffset = iVar3 + iVar2 * 0x10;
  }
  return;
}

Assistant:

void HlslParseContext::handlePackOffset(const TSourceLoc& loc, TQualifier& qualifier, const glslang::TString& location,
                                        const glslang::TString* component)
{
    if (location.size() == 0 || location[0] != 'c') {
        error(loc, "expected 'c'", "packoffset", "");
        return;
    }
    if (location.size() == 1)
        return;
    if (! isdigit(location[1])) {
        error(loc, "expected number after 'c'", "packoffset", "");
        return;
    }

    qualifier.layoutOffset = 16 * atoi(location.substr(1, location.size()).c_str());
    if (component != nullptr) {
        int componentOffset = 0;
        switch ((*component)[0]) {
        case 'x': componentOffset =  0; break;
        case 'y': componentOffset =  4; break;
        case 'z': componentOffset =  8; break;
        case 'w': componentOffset = 12; break;
        default:
            componentOffset = -1;
            break;
        }
        if (componentOffset < 0 || component->size() > 1) {
            error(loc, "expected {x, y, z, w} for component", "packoffset", "");
            return;
        }
        qualifier.layoutOffset += componentOffset;
    }
}